

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash-sha2-512.c
# Opt level: O0

void p_crypto_hash_sha2_512_update(PHashSHA2_512 *ctx,puchar *data,psize len)

{
  ulong uVar1;
  uint uVar2;
  uint local_24;
  puint32 to_fill;
  puint32 left;
  psize len_local;
  puchar *data_local;
  PHashSHA2_512 *ctx_local;
  
  uVar1 = ctx->len_low;
  local_24 = (uint)uVar1 & 0x7f;
  uVar2 = 0x80 - local_24;
  ctx->len_low = len + ctx->len_low;
  if (ctx->len_low < len) {
    ctx->len_high = ctx->len_high + 1;
  }
  _to_fill = len;
  len_local = (psize)data;
  if (((uVar1 & 0x7f) != 0) && (uVar2 <= len)) {
    memcpy((void *)((long)ctx->hash + ((ulong)local_24 - 0x80)),data,(ulong)uVar2);
    pp_crypto_hash_sha2_512_swap_bytes((puint64 *)ctx,0x10);
    pp_crypto_hash_sha2_512_process(ctx,(puint64 *)ctx);
    len_local = (psize)(data + uVar2);
    _to_fill = len - uVar2;
    local_24 = 0;
  }
  for (; 0x7f < _to_fill; _to_fill = _to_fill - 0x80) {
    memcpy(ctx,(void *)len_local,0x80);
    pp_crypto_hash_sha2_512_swap_bytes((puint64 *)ctx,0x10);
    pp_crypto_hash_sha2_512_process(ctx,(puint64 *)ctx);
    len_local = len_local + 0x80;
  }
  if (_to_fill != 0) {
    memcpy((void *)((long)ctx->hash + ((ulong)local_24 - 0x80)),(void *)len_local,_to_fill);
  }
  return;
}

Assistant:

void
p_crypto_hash_sha2_512_update (PHashSHA2_512	*ctx,
			       const puchar	*data,
			       psize		len)
{
	puint32	left;
	puint32	to_fill;

	left = (puint32) (ctx->len_low & 0x7F);
	to_fill = 128 - left;

	ctx->len_low += (puint64) len;

	if (ctx->len_low < (puint64) len)
		++ctx->len_high;

	if (left && (puint64) len >= to_fill) {
		memcpy (ctx->buf.buf + left, data, to_fill);
		pp_crypto_hash_sha2_512_swap_bytes (ctx->buf.buf_w, 16);
		pp_crypto_hash_sha2_512_process (ctx, ctx->buf.buf_w);

		data += to_fill;
		len -= to_fill;
		left = 0;
	}

	while (len >= 128) {
		memcpy (ctx->buf.buf, data, 128);
		pp_crypto_hash_sha2_512_swap_bytes (ctx->buf.buf_w, 16);
		pp_crypto_hash_sha2_512_process (ctx, ctx->buf.buf_w);

		data += 128;
		len -= 128;
	}

	if (len > 0)
		memcpy (ctx->buf.buf + left, data, len);
}